

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

void run_app(int argc,char **argv,SDL_Window *window)

{
  float fVar1;
  void *pvVar2;
  undefined4 uVar3;
  bool bVar4;
  int iVar5;
  Uint32 UVar6;
  ImGuiIO *pIVar7;
  stbi_uc *__first;
  ImGuiIO *pIVar8;
  ImDrawData *draw_data;
  bool bVar9;
  ulong uVar11;
  allocator local_149;
  GLuint vao;
  GLuint colormap_texture;
  vector<unsigned_char,_std::allocator<unsigned_char>_> colormap;
  int w;
  undefined4 uStack_11c;
  pointer local_118;
  pointer local_110;
  SDL_Event event;
  Shader display_colormap;
  TransferFunctionWidget tfn_widget;
  bool bVar10;
  
  pIVar7 = ImGui::GetIO();
  tfnw::TransferFunctionWidget::TransferFunctionWidget(&tfn_widget);
  if (1 < argc) {
    uVar11 = 1;
    do {
      __first = stbi_load(argv[uVar11],&w,(int *)&colormap_texture,(int *)&vao,4);
      std::vector<unsigned_char,std::allocator<unsigned_char>>::vector<unsigned_char*,void>
                ((vector<unsigned_char,std::allocator<unsigned_char>> *)&colormap,__first,
                 __first + (long)w * 4,(allocator_type *)&display_colormap);
      stbi_image_free(__first);
      std::__cxx11::string::string((string *)&event.common,argv[uVar11],&local_149);
      tfnw::Colormap::Colormap((Colormap *)&display_colormap,(string *)&event.common,&colormap,SRGB)
      ;
      tfnw::TransferFunctionWidget::add_colormap(&tfn_widget,(Colormap *)&display_colormap);
      if (display_colormap.uniforms._M_h._M_element_count != 0) {
        operator_delete((void *)display_colormap.uniforms._M_h._M_element_count,
                        display_colormap.uniforms._M_h._M_rehash_policy._M_next_resize -
                        display_colormap.uniforms._M_h._M_element_count);
      }
      if ((size_type *)CONCAT44(display_colormap._4_4_,display_colormap.program) !=
          &display_colormap.uniforms._M_h._M_bucket_count) {
        operator_delete((undefined1 *)CONCAT44(display_colormap._4_4_,display_colormap.program),
                        display_colormap.uniforms._M_h._M_bucket_count + 1);
      }
      if ((Sint32 *)CONCAT44(event.common.timestamp,event.type) != &event.display.data1) {
        operator_delete((undefined1 *)CONCAT44(event.common.timestamp,event.type),
                        CONCAT44(event.window.data2,event.display.data1) + 1);
      }
      if (colormap.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(colormap.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)colormap.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)colormap.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      uVar11 = uVar11 + 1;
    } while ((uint)argc != uVar11);
  }
  (*_ptrc_glGenTextures)(1,&colormap_texture);
  (*_ptrc_glBindTexture)(0xde0,colormap_texture);
  (*_ptrc_glTexParameteri)(0xde0,0x2801,0x2601);
  (*_ptrc_glTexParameteri)(0xde0,0x2800,0x2601);
  (*_ptrc_glTexParameteri)(0xde0,0x2802,0x812f);
  tfnw::TransferFunctionWidget::get_colormap(&colormap,&tfn_widget);
  (*_ptrc_glTexImage1D)
            (0xde0,0,0x8058,
             (GLsizei)((ulong)((long)colormap.
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                              (long)colormap.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_start) >> 2),0,0x1908,0x1401
             ,colormap.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start);
  (*_ptrc_glGenVertexArrays)(1,&vao);
  (*_ptrc_glBindVertexArray)(vao);
  (*_ptrc_glClearColor)(0.0,0.0,0.0,1.0);
  (*_ptrc_glDisable)(0xb71);
  (*_ptrc_glEnable)(0xbe2);
  (*_ptrc_glBlendFunc)(1,0x303);
  Shader::Shader(&display_colormap,&display_colormap_vs_abi_cxx11_,&display_colormap_fs_abi_cxx11_);
  bVar9 = false;
  bVar10 = false;
  do {
    while( true ) {
      iVar5 = SDL_PollEvent(&event);
      if (iVar5 == 0) break;
      ImGui_ImplSDL2_ProcessEvent(&event);
      uVar3 = event.display.display;
      bVar9 = bVar10;
      if (event.window.data2 == 0x1b) {
        bVar9 = true;
      }
      if (pIVar7->WantCaptureKeyboard != false) {
        bVar9 = bVar10;
      }
      if (event.type != 0x300) {
        bVar9 = bVar10;
      }
      if (event.type == 0x100) {
        bVar9 = true;
      }
      if ((event.type == 0x200) && (event.display.event == '\x0e')) {
        UVar6 = SDL_GetWindowID(window);
        if (uVar3 == UVar6) {
          bVar9 = true;
        }
      }
      bVar10 = bVar9;
      if ((event.type == 0x200) && (event.display.event == '\x05')) {
        win_width = event.display.data1;
        win_height = event.window.data2;
        (pIVar7->DisplaySize).x = (float)event.display.data1;
        (pIVar7->DisplaySize).y = (float)event.window.data2;
      }
    }
    bVar4 = tfnw::TransferFunctionWidget::changed(&tfn_widget);
    if (bVar4) {
      tfnw::TransferFunctionWidget::get_colormap
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&w,&tfn_widget);
      (*_ptrc_glTexImage1D)
                (0xde0,0,0x8058,
                 (GLsizei)((ulong)((long)local_118 - (long)CONCAT44(uStack_11c,w)) >> 2),0,0x1908,
                 0x1401,(void *)CONCAT44(uStack_11c,w));
      pvVar2 = (void *)CONCAT44(uStack_11c,w);
      if (pvVar2 != (void *)0x0) {
        operator_delete(pvVar2,(long)local_110 - (long)pvVar2);
      }
    }
    ImGui_ImplOpenGL3_NewFrame();
    ImGui_ImplSDL2_NewFrame();
    ImGui::NewFrame();
    ImGui::Begin("Debug Panel",(bool *)0x0,0);
    pIVar8 = ImGui::GetIO();
    fVar1 = pIVar8->Framerate;
    pIVar8 = ImGui::GetIO();
    ImGui::Text("Application average %.3f ms/frame (%.1f FPS)",(double)(1000.0 / fVar1),
                (double)pIVar8->Framerate);
    tfnw::TransferFunctionWidget::draw_ui(&tfn_widget);
    ImGui::End();
    ImGui::Render();
    (*_ptrc_glViewport)(0,0,(int)(pIVar7->DisplaySize).x,(int)(pIVar7->DisplaySize).y);
    (*_ptrc_glClear)(0x4100);
    (*_ptrc_glUseProgram)(display_colormap.program);
    (*_ptrc_glDrawArrays)(5,0,4);
    draw_data = ImGui::GetDrawData();
    ImGui_ImplOpenGL3_RenderDrawData(draw_data);
    SDL_GL_SwapWindow(window);
  } while (!bVar9);
  Shader::~Shader(&display_colormap);
  if (colormap.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(colormap.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)colormap.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)colormap.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (tfn_widget.alpha_control_pts.
      super__Vector_base<tfnw::TransferFunctionWidget::vec2f,_std::allocator<tfnw::TransferFunctionWidget::vec2f>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(tfn_widget.alpha_control_pts.
                    super__Vector_base<tfnw::TransferFunctionWidget::vec2f,_std::allocator<tfnw::TransferFunctionWidget::vec2f>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)tfn_widget.alpha_control_pts.
                          super__Vector_base<tfnw::TransferFunctionWidget::vec2f,_std::allocator<tfnw::TransferFunctionWidget::vec2f>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)tfn_widget.alpha_control_pts.
                          super__Vector_base<tfnw::TransferFunctionWidget::vec2f,_std::allocator<tfnw::TransferFunctionWidget::vec2f>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (tfn_widget.current_colormap.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(tfn_widget.current_colormap.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)tfn_widget.current_colormap.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)tfn_widget.current_colormap.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  std::vector<tfnw::Colormap,_std::allocator<tfnw::Colormap>_>::~vector(&tfn_widget.colormaps);
  return;
}

Assistant:

void run_app(int argc, const char **argv, SDL_Window *window)
{
    ImGuiIO &io = ImGui::GetIO();

    tfnw::TransferFunctionWidget tfn_widget;

    // Load any extra colormaps the user wants to see in the demo
    for (int i = 1; i < argc; ++i) {
        int w, h, n;
        uint8_t *img_data = stbi_load(argv[i], &w, &h, &n, 4);
        auto img = std::vector<uint8_t>(img_data, img_data + w * 1 * 4);
        stbi_image_free(img_data);
        // Input images are assumed to be sRGB color-space
        tfn_widget.add_colormap(tfnw::Colormap(argv[i], img, tfnw::SRGB));
    }

    // A texture so we can color the background of the window by the colormap
    GLuint colormap_texture;
    glGenTextures(1, &colormap_texture);
    glBindTexture(GL_TEXTURE_1D, colormap_texture);
    glTexParameteri(GL_TEXTURE_1D, GL_TEXTURE_MIN_FILTER, GL_LINEAR);
    glTexParameteri(GL_TEXTURE_1D, GL_TEXTURE_MAG_FILTER, GL_LINEAR);
    glTexParameteri(GL_TEXTURE_1D, GL_TEXTURE_WRAP_S, GL_CLAMP_TO_EDGE);
    auto colormap = tfn_widget.get_colormap();
    glTexImage1D(GL_TEXTURE_1D,
                 0,
                 GL_RGBA8,
                 colormap.size() / 4,
                 0,
                 GL_RGBA,
                 GL_UNSIGNED_BYTE,
                 colormap.data());

    GLuint vao;
    glGenVertexArrays(1, &vao);
    glBindVertexArray(vao);

    glClearColor(0.0, 0.0, 0.0, 1.0);
    glDisable(GL_DEPTH_TEST);
    glEnable(GL_BLEND);
    glBlendFunc(GL_ONE, GL_ONE_MINUS_SRC_ALPHA);

    Shader display_colormap(display_colormap_vs, display_colormap_fs);

    bool done = false;
    while (!done) {
        SDL_Event event;
        while (SDL_PollEvent(&event)) {
            ImGui_ImplSDL2_ProcessEvent(&event);
            if (event.type == SDL_QUIT) {
                done = true;
            }
            if (!io.WantCaptureKeyboard && event.type == SDL_KEYDOWN &&
                event.key.keysym.sym == SDLK_ESCAPE) {
                done = true;
            }
            if (event.type == SDL_WINDOWEVENT && event.window.event == SDL_WINDOWEVENT_CLOSE &&
                event.window.windowID == SDL_GetWindowID(window)) {
                done = true;
            }
            if (event.type == SDL_WINDOWEVENT &&
                event.window.event == SDL_WINDOWEVENT_RESIZED) {
                win_width = event.window.data1;
                win_height = event.window.data2;
                io.DisplaySize.x = win_width;
                io.DisplaySize.y = win_height;
            }
        }

        if (tfn_widget.changed()) {
            auto colormap = tfn_widget.get_colormap();
            glTexImage1D(GL_TEXTURE_1D,
                         0,
                         GL_RGBA8,
                         colormap.size() / 4,
                         0,
                         GL_RGBA,
                         GL_UNSIGNED_BYTE,
                         colormap.data());
        }

        ImGui_ImplOpenGL3_NewFrame();
        ImGui_ImplSDL2_NewFrame(window);
        ImGui::NewFrame();

        ImGui::Begin("Debug Panel");
        ImGui::Text("Application average %.3f ms/frame (%.1f FPS)",
                    1000.0f / ImGui::GetIO().Framerate,
                    ImGui::GetIO().Framerate);
        tfn_widget.draw_ui();
        ImGui::End();

        // Rendering
        ImGui::Render();
        glViewport(0, 0, (int)io.DisplaySize.x, (int)io.DisplaySize.y);

        glClear(GL_COLOR_BUFFER_BIT | GL_DEPTH_BUFFER_BIT);
        glUseProgram(display_colormap.program);
        glDrawArrays(GL_TRIANGLE_STRIP, 0, 4);

        ImGui_ImplOpenGL3_RenderDrawData(ImGui::GetDrawData());

        SDL_GL_SwapWindow(window);
    }
}